

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_filters.cpp
# Opt level: O0

float __thiscall
DSDcc::DSDMBEAudioInterpolatorFilter::run(DSDMBEAudioInterpolatorFilter *this,float *sample)

{
  float *in_RSI;
  IIRFilter<float,_2U> *in_RDI;
  float local_24;
  float local_14 [5];
  
  if (((uint)in_RDI[2].m_a[0] & 1) == 0) {
    local_24 = IIRFilter<float,_2U>::run(in_RDI,in_RSI);
  }
  else {
    local_14[0] = IIRFilter<float,_2U>::run(in_RDI + 1,in_RSI);
    local_24 = IIRFilter<float,_2U>::run(in_RDI,local_14);
  }
  return local_24;
}

Assistant:

float DSDMBEAudioInterpolatorFilter::run(const float& sample)
{
    return m_useHP ? m_filterLP.run(m_filterHP.run(sample)) : m_filterLP.run(sample);
}